

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestBuildHandler.cxx
# Opt level: O2

int __thiscall cmCTestBuildHandler::ProcessSingleLine(cmCTestBuildHandler *this,char *data)

{
  cmCTest *pcVar1;
  pointer pRVar2;
  pointer pRVar3;
  cmCTestBuildHandler *pcVar4;
  bool bVar5;
  int iVar6;
  ostream *poVar7;
  int iVar8;
  pointer this_00;
  long lVar9;
  pointer pRVar10;
  bool bVar11;
  char *local_1d0 [4];
  cmCTestBuildHandler *local_1b0;
  ostringstream cmCTestLog_msg;
  
  if (this->UseCTestLaunch != false) {
    return 0;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
  poVar7 = std::operator<<((ostream *)&cmCTestLog_msg,"Line: [");
  poVar7 = std::operator<<(poVar7,data);
  poVar7 = std::operator<<(poVar7,"]");
  std::endl<char,std::char_traits<char>>(poVar7);
  pcVar1 = (this->super_cmCTestGenericHandler).CTest;
  std::__cxx11::stringbuf::str();
  cmCTest::Log(pcVar1,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CTest/cmCTestBuildHandler.cxx"
               ,0x440,local_1d0[0],(this->super_cmCTestGenericHandler).Quiet);
  std::__cxx11::string::~string((string *)local_1d0);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
  bVar11 = true;
  if (this->ErrorQuotaReached == false) {
    pRVar2 = (this->ErrorMatchRegex).
             super__Vector_base<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    lVar9 = 0;
    for (pRVar10 = (this->ErrorMatchRegex).
                   super__Vector_base<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>
                   ._M_impl.super__Vector_impl_data._M_start; bVar11 = pRVar10 == pRVar2, !bVar11;
        pRVar10 = pRVar10 + 1) {
      bVar5 = cmsys::RegularExpression::find(pRVar10,data);
      if (bVar5) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
        poVar7 = std::operator<<((ostream *)&cmCTestLog_msg,"  Error Line: ");
        poVar7 = std::operator<<(poVar7,data);
        poVar7 = std::operator<<(poVar7," (matches: ");
        poVar7 = std::operator<<(poVar7,(string *)
                                        ((long)(this->CustomErrorMatches).
                                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                               ._M_impl.super__Vector_impl_data._M_start - lVar9));
        poVar7 = std::operator<<(poVar7,")");
        std::endl<char,std::char_traits<char>>(poVar7);
        pcVar1 = (this->super_cmCTestGenericHandler).CTest;
        std::__cxx11::stringbuf::str();
        cmCTest::Log(pcVar1,0,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CTest/cmCTestBuildHandler.cxx"
                     ,0x451,local_1d0[0],(this->super_cmCTestGenericHandler).Quiet);
        std::__cxx11::string::~string((string *)local_1d0);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
        break;
      }
      lVar9 = lVar9 + -0x20;
    }
    pRVar2 = (this->ErrorExceptionRegex).
             super__Vector_base<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    lVar9 = 0;
    for (pRVar10 = (this->ErrorExceptionRegex).
                   super__Vector_base<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>
                   ._M_impl.super__Vector_impl_data._M_start; pRVar10 != pRVar2;
        pRVar10 = pRVar10 + 1) {
      bVar5 = cmsys::RegularExpression::find(pRVar10,data);
      if (bVar5) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
        poVar7 = std::operator<<((ostream *)&cmCTestLog_msg,"  Not an error Line: ");
        poVar7 = std::operator<<(poVar7,data);
        poVar7 = std::operator<<(poVar7," (matches: ");
        poVar7 = std::operator<<(poVar7,(string *)
                                        ((long)(this->CustomErrorExceptions).
                                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                               ._M_impl.super__Vector_impl_data._M_start - lVar9));
        poVar7 = std::operator<<(poVar7,")");
        std::endl<char,std::char_traits<char>>(poVar7);
        pcVar1 = (this->super_cmCTestGenericHandler).CTest;
        std::__cxx11::stringbuf::str();
        cmCTest::Log(pcVar1,0,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CTest/cmCTestBuildHandler.cxx"
                     ,0x460,local_1d0[0],(this->super_cmCTestGenericHandler).Quiet);
        std::__cxx11::string::~string((string *)local_1d0);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
        bVar11 = true;
        break;
      }
      lVar9 = lVar9 + -0x20;
    }
  }
  if (this->WarningQuotaReached == false) {
    pRVar2 = (this->WarningMatchRegex).
             super__Vector_base<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    lVar9 = 0;
    for (pRVar10 = (this->WarningMatchRegex).
                   super__Vector_base<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>
                   ._M_impl.super__Vector_impl_data._M_start; pRVar10 != pRVar2;
        pRVar10 = pRVar10 + 1) {
      bVar5 = cmsys::RegularExpression::find(pRVar10,data);
      if (bVar5) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
        poVar7 = std::operator<<((ostream *)&cmCTestLog_msg,"  Warning Line: ");
        poVar7 = std::operator<<(poVar7,data);
        poVar7 = std::operator<<(poVar7," (matches: ");
        poVar7 = std::operator<<(poVar7,(string *)
                                        ((long)(this->CustomWarningMatches).
                                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                               ._M_impl.super__Vector_impl_data._M_start - lVar9));
        poVar7 = std::operator<<(poVar7,")");
        std::endl<char,std::char_traits<char>>(poVar7);
        pcVar1 = (this->super_cmCTestGenericHandler).CTest;
        std::__cxx11::stringbuf::str();
        cmCTest::Log(pcVar1,0,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CTest/cmCTestBuildHandler.cxx"
                     ,0x471,local_1d0[0],(this->super_cmCTestGenericHandler).Quiet);
        std::__cxx11::string::~string((string *)local_1d0);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
        break;
      }
      lVar9 = lVar9 + -0x20;
    }
    pRVar3 = (this->WarningExceptionRegex).
             super__Vector_base<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    lVar9 = 0;
    local_1b0 = this;
    for (this_00 = (this->WarningExceptionRegex).
                   super__Vector_base<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>
                   ._M_impl.super__Vector_impl_data._M_start; this_00 != pRVar3;
        this_00 = this_00 + 1) {
      bVar5 = cmsys::RegularExpression::find(this_00,data);
      if (bVar5) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
        poVar7 = std::operator<<((ostream *)&cmCTestLog_msg,"  Not a warning Line: ");
        pcVar4 = local_1b0;
        poVar7 = std::operator<<(poVar7,data);
        poVar7 = std::operator<<(poVar7," (matches: ");
        poVar7 = std::operator<<(poVar7,(string *)
                                        ((long)(pcVar4->CustomWarningExceptions).
                                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                               ._M_impl.super__Vector_impl_data._M_start - lVar9));
        poVar7 = std::operator<<(poVar7,")");
        std::endl<char,std::char_traits<char>>(poVar7);
        pcVar1 = (pcVar4->super_cmCTestGenericHandler).CTest;
        std::__cxx11::stringbuf::str();
        cmCTest::Log(pcVar1,0,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CTest/cmCTestBuildHandler.cxx"
                     ,0x481,local_1d0[0],(pcVar4->super_cmCTestGenericHandler).Quiet);
        std::__cxx11::string::~string((string *)local_1d0);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
        goto LAB_0015a4c9;
      }
      lVar9 = lVar9 + -0x20;
    }
    if (pRVar10 != pRVar2) {
      iVar8 = 1;
      goto LAB_0015a4cb;
    }
  }
LAB_0015a4c9:
  iVar8 = 0;
LAB_0015a4cb:
  iVar6 = 2;
  if (bVar11) {
    iVar6 = iVar8;
  }
  return iVar6;
}

Assistant:

int cmCTestBuildHandler::ProcessSingleLine(const char* data)
{
  if (this->UseCTestLaunch) {
    // No log scraping when using launchers.
    return b_REGULAR_LINE;
  }

  cmCTestOptionalLog(this->CTest, DEBUG, "Line: [" << data << "]" << std::endl,
                     this->Quiet);

  int warningLine = 0;
  int errorLine = 0;

  // Check for regular expressions

  if (!this->ErrorQuotaReached) {
    // Errors
    int wrxCnt = 0;
    for (cmsys::RegularExpression& rx : this->ErrorMatchRegex) {
      if (rx.find(data)) {
        errorLine = 1;
        cmCTestOptionalLog(this->CTest, DEBUG,
                           "  Error Line: " << data << " (matches: "
                                            << this->CustomErrorMatches[wrxCnt]
                                            << ")" << std::endl,
                           this->Quiet);
        break;
      }
      wrxCnt++;
    }
    // Error exceptions
    wrxCnt = 0;
    for (cmsys::RegularExpression& rx : this->ErrorExceptionRegex) {
      if (rx.find(data)) {
        errorLine = 0;
        cmCTestOptionalLog(this->CTest, DEBUG,
                           "  Not an error Line: "
                             << data << " (matches: "
                             << this->CustomErrorExceptions[wrxCnt] << ")"
                             << std::endl,
                           this->Quiet);
        break;
      }
      wrxCnt++;
    }
  }
  if (!this->WarningQuotaReached) {
    // Warnings
    int wrxCnt = 0;
    for (cmsys::RegularExpression& rx : this->WarningMatchRegex) {
      if (rx.find(data)) {
        warningLine = 1;
        cmCTestOptionalLog(this->CTest, DEBUG,
                           "  Warning Line: "
                             << data << " (matches: "
                             << this->CustomWarningMatches[wrxCnt] << ")"
                             << std::endl,
                           this->Quiet);
        break;
      }
      wrxCnt++;
    }

    wrxCnt = 0;
    // Warning exceptions
    for (cmsys::RegularExpression& rx : this->WarningExceptionRegex) {
      if (rx.find(data)) {
        warningLine = 0;
        cmCTestOptionalLog(this->CTest, DEBUG,
                           "  Not a warning Line: "
                             << data << " (matches: "
                             << this->CustomWarningExceptions[wrxCnt] << ")"
                             << std::endl,
                           this->Quiet);
        break;
      }
      wrxCnt++;
    }
  }
  if (errorLine) {
    return b_ERROR_LINE;
  }
  if (warningLine) {
    return b_WARNING_LINE;
  }
  return b_REGULAR_LINE;
}